

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O1

Result __thiscall
wabt::SharedValidator::CheckIndexWithValue<wabt::SharedValidator::TableType>
          (SharedValidator *this,Var *var,
          vector<wabt::SharedValidator::TableType,_std::allocator<wabt::SharedValidator::TableType>_>
          *values,TableType *out,char *desc)

{
  uint uVar1;
  pointer pTVar2;
  uint64_t uVar3;
  Result RVar4;
  Enum EVar5;
  Index IVar6;
  undefined4 local_a0;
  undefined1 local_9c;
  uint64_t local_98;
  undefined7 uStack_90;
  undefined4 uStack_89;
  Var local_78;
  
  Var::Var(&local_78,var);
  RVar4 = CheckIndex(this,&local_78,
                     (Index)((ulong)((long)(values->
                                           super__Vector_base<wabt::SharedValidator::TableType,_std::allocator<wabt::SharedValidator::TableType>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(values->
                                          super__Vector_base<wabt::SharedValidator::TableType,_std::allocator<wabt::SharedValidator::TableType>_>
                                          )._M_impl.super__Vector_impl_data._M_start) >> 5),desc);
  Var::~Var(&local_78);
  if (out != (TableType *)0x0) {
    if (RVar4.enum_ == Ok) {
      if (var->type_ != Index) {
        __assert_fail("is_index()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/ir.h"
                      ,0x3a,"Index wabt::Var::index() const");
      }
      uVar1 = (var->field_2).index_;
      pTVar2 = (values->
               super__Vector_base<wabt::SharedValidator::TableType,_std::allocator<wabt::SharedValidator::TableType>_>
               )._M_impl.super__Vector_impl_data._M_start;
      EVar5 = pTVar2[uVar1].element.enum_;
      IVar6 = pTVar2[uVar1].element.type_index_;
      local_98 = pTVar2[uVar1].limits.initial;
      uVar3 = pTVar2[uVar1].limits.max;
      uStack_90 = (undefined7)uVar3;
      uStack_89._1_3_ =
           (undefined3)((uint)*(undefined4 *)((long)&pTVar2[uVar1].limits.max + 7) >> 8);
      uStack_89._0_1_ = (undefined1)(uVar3 >> 0x38);
      local_a0 = *(undefined4 *)&pTVar2[uVar1].limits.field_0x13;
      local_9c = pTVar2[uVar1].limits.field_0x17;
    }
    else {
      EVar5 = Any;
      local_a0 = 0;
      local_9c = 0;
      local_98 = 0;
      uStack_90 = 0;
      uStack_89 = 0;
      IVar6 = 0xffffffff;
    }
    (out->element).enum_ = EVar5;
    (out->element).type_index_ = IVar6;
    (out->limits).initial = local_98;
    (out->limits).max = CONCAT17((undefined1)uStack_89,uStack_90);
    *(undefined4 *)((long)&(out->limits).max + 7) = uStack_89;
    *(undefined4 *)&(out->limits).field_0x13 = local_a0;
    (out->limits).field_0x17 = local_9c;
  }
  return (Result)RVar4.enum_;
}

Assistant:

Result SharedValidator::CheckIndexWithValue(Var var,
                                            const std::vector<T>& values,
                                            T* out,
                                            const char* desc) {
  Result result = CheckIndex(var, values.size(), desc);
  if (out) {
    *out = Succeeded(result) ? values[var.index()] : T{};
  }
  return result;
}